

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralloc.c
# Opt level: O0

linear_header * create_linear_node(void *ralloc_ctx,uint min_size)

{
  linear_header *node;
  uint min_size_local;
  void *ralloc_ctx_local;
  
  node._4_4_ = min_size + 8;
  if (node._4_4_ < 0x800) {
    node._4_4_ = 0x800;
  }
  ralloc_ctx_local = ralloc_size(ralloc_ctx,(ulong)node._4_4_ + 0x30);
  if ((undefined4 *)ralloc_ctx_local == (undefined4 *)0x0) {
    ralloc_ctx_local = (void *)0x0;
  }
  else {
    *(undefined4 *)ralloc_ctx_local = 0x87b9c7d3;
    *(undefined4 *)((long)ralloc_ctx_local + 4) = 0;
    *(uint *)((long)ralloc_ctx_local + 8) = node._4_4_;
    *(void **)((long)ralloc_ctx_local + 0x10) = ralloc_ctx;
    *(undefined8 *)((long)ralloc_ctx_local + 0x18) = 0;
    *(void **)((long)ralloc_ctx_local + 0x20) = ralloc_ctx_local;
  }
  return (linear_header *)ralloc_ctx_local;
}

Assistant:

static linear_header *
create_linear_node(void *ralloc_ctx, unsigned min_size)
{
   linear_header *node;

   min_size += sizeof(linear_size_chunk);

   if (likely(min_size < MIN_LINEAR_BUFSIZE))
      min_size = MIN_LINEAR_BUFSIZE;

   node = ralloc_size(ralloc_ctx, sizeof(linear_header) + min_size);
   if (unlikely(!node))
      return NULL;

#ifndef NDEBUG
   node->magic = LMAGIC;
#endif
   node->offset = 0;
   node->size = min_size;
   node->ralloc_parent = ralloc_ctx;
   node->next = NULL;
   node->latest = node;
   return node;
}